

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O1

void __thiscall
supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>::
SortedSingleFileIndexedStorage
          (SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char> *this,
          vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
          *newer,string *dataFileName,shared_ptr<supermap::io::FileManager> *fileManager,
          char batchSize,InnerRegisterSupplier *registerSupplier)

{
  _Manager_type p_Var1;
  pointer pSVar2;
  pointer pSVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
  *pvVar7;
  char cVar8;
  char cVar9;
  undefined2 uVar10;
  _Storage<supermap::KeyValue<char,_char>,_true> _Var11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  pointer poVar16;
  undefined3 in_register_00000081;
  long lVar17;
  long lVar18;
  size_type __n;
  long lVar19;
  ulong uVar20;
  KeyValue<char,_char> minItem;
  vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
  writeBuffer;
  vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
  frontLine;
  vector<char,_std::allocator<char>_> currentFrontPointers;
  KeyValue<char,_char> local_102;
  SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char> *local_100;
  vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_> local_f8;
  ulong local_d8;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
  *local_d0;
  int local_c4;
  vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
  local_c0;
  size_type local_a8;
  path local_a0;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type local_60;
  shared_ptr<supermap::io::FileManager> local_58;
  long local_40;
  long local_38;
  
  local_100 = this;
  std::filesystem::__cxx11::path::path(&local_a0,dataFileName,auto_format);
  local_58.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_58.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_68 = (_Manager_type)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = registerSupplier->_M_invoker;
  p_Var1 = (registerSupplier->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_78._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(registerSupplier->super__Function_base)._M_functor;
    local_78._8_8_ = *(undefined8 *)((long)&(registerSupplier->super__Function_base)._M_functor + 8)
    ;
    (registerSupplier->super__Function_base)._M_manager = (_Manager_type)0x0;
    registerSupplier->_M_invoker = (_Invoker_type)0x0;
    local_68 = p_Var1;
  }
  SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>::SingleFileIndexedStorage
            (&local_100->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>,
             &local_a0,&local_58,(InnerRegisterSupplier *)&local_78);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  local_d8 = CONCAT44(local_d8._4_4_,CONCAT31(in_register_00000081,batchSize));
  if (local_58.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::filesystem::__cxx11::path::~path(&local_a0);
  (local_100->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
  super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
  super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>._vptr_OrderedStorage =
       (_func_int **)&PTR_append_00203678;
  (local_100->super_Findable<supermap::KeyValue<char,_char>,_char>)._vptr_Findable =
       (_func_int **)&DAT_002036c0;
  pSVar2 = (newer->
           super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (newer->
           super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __n = ((long)pSVar3 - (long)pSVar2 >> 3) * 0x6db6db6db6db6db7;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_a0,__n,(allocator_type *)&local_c0);
  local_f8.
  super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_3_ =
       (uint3)(ushort)local_f8.
                      super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
  ::vector(&local_c0,__n,(value_type *)&local_f8,(allocator_type *)&local_102);
  local_d0 = newer;
  if (pSVar3 == pSVar2) {
    lVar17 = 0;
  }
  else {
    lVar15 = __n + (__n == 0);
    lVar18 = 2;
    lVar19 = 0;
    lVar17 = 0;
    do {
      pSVar2 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      cVar8 = (**(code **)(*(long *)((long)&(pSVar2->
                                            super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                            ).
                                            super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                            .
                                            super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                            ._vptr_OrderedStorage + lVar19) + 8))
                        ((long)&(pSVar2->
                                super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                ).super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                                super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                                _vptr_OrderedStorage + lVar19);
      poVar16 = local_c0.
                super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ('\0' < cVar8) {
        pSVar2 = (newer->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar10 = (**(code **)(*(long *)((long)&(pSVar2->
                                               super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                               ).
                                               super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                               .
                                               super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                               ._vptr_OrderedStorage + lVar19) + 0x20))
                           ((long)&(pSVar2->
                                   super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                   ).
                                   super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                                   super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                                   _vptr_OrderedStorage + lVar19,0);
        newer = local_d0;
        if (*(char *)((long)&(poVar16->
                             super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>).
                             _M_payload.
                             super__Optional_payload_base<supermap::KeyValue<char,_char>_>.
                             _M_payload + lVar18) == '\x01') {
          *(undefined1 *)
           ((long)&(poVar16->super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>).
                   _M_payload.super__Optional_payload_base<supermap::KeyValue<char,_char>_>.
                   _M_payload + lVar18) = 0;
        }
        *(undefined2 *)((long)poVar16 + lVar18 + -2) = uVar10;
        *(undefined1 *)
         ((long)&(poVar16->super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>).
                 _M_payload.super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_payload
         + lVar18) = 1;
        pSVar2 = (local_d0->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        cVar8 = (**(code **)(*(long *)((long)&(pSVar2->
                                              super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                              ).
                                              super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                              .
                                              super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                              ._vptr_OrderedStorage + lVar19) + 8))
                          ((long)&(pSVar2->
                                  super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                  ).super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                  .super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                                  _vptr_OrderedStorage + lVar19);
        lVar17 = lVar17 + cVar8;
      }
      lVar19 = lVar19 + 0x38;
      lVar18 = lVar18 + 3;
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  (*(local_100->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
    super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
    super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.register_.
    super_StorageItemRegister<supermap::KeyValue<char,_char>,_supermap::CountingStorageInfo<char,_void>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_supermap::CountingStorageInfo<char,_void>_>_>
    ._vptr_Cloneable[5])
            (&(local_100->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
              ).super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
              super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.register_,lVar17);
  local_f8.
  super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar8 = (char)local_d8;
  local_a8 = (size_type)cVar8;
  std::vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>::
  reserve(&local_f8,local_a8);
  uVar20 = (ulong)((int)__n - 1);
  local_c4 = (int)cVar8;
  local_38 = uVar20 * 3 + 2;
  local_40 = uVar20 * 0x38;
  local_d8 = uVar20;
  do {
    if ((int)uVar20 < 0) {
      uVar14 = 0;
      bVar5 = false;
    }
    else {
      uVar13 = 0;
      lVar17 = local_40;
      lVar15 = local_38;
      bVar6 = false;
      do {
        uVar14 = uVar13;
        bVar5 = bVar6;
        if ((*(char *)((long)&((local_c0.
                                super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>).
                              _M_payload.
                              super__Optional_payload_base<supermap::KeyValue<char,_char>_>.
                              _M_payload + lVar15) == '\x01') &&
           (uVar14 = uVar20, bVar5 = true, bVar6)) {
          if (local_c0.
              super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar13].
              super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>._M_payload.
              super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_engaged == false) {
            std::__throw_bad_optional_access();
          }
          cVar8 = local_c0.
                  super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar13].
                  super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>._M_payload.
                  super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_payload._M_value.
                  key;
          cVar9 = *(char *)((long)local_c0.
                                  super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar15 + -2);
          bVar5 = bVar6;
          if ((cVar8 <= cVar9) && (uVar14 = uVar13, cVar9 == cVar8)) {
            cVar8 = local_a0._M_pathname._M_dataplus._M_p[uVar20];
            local_a0._M_pathname._M_dataplus._M_p[uVar20] = cVar8 + '\x01';
            pSVar2 = (local_d0->
                     super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            cVar9 = (**(code **)(*(long *)((long)&(pSVar2->
                                                  super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                                  ).
                                                  super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                                  .
                                                  super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                                  ._vptr_OrderedStorage + lVar17) + 8))
                              ((long)&(pSVar2->
                                      super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                      ).
                                      super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                      .
                                      super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                      ._vptr_OrderedStorage + lVar17);
            poVar16 = local_c0.
                      super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((char)(cVar8 + '\x01') < cVar9) {
              pSVar2 = (local_d0->
                       super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar10 = (**(code **)(*(long *)((long)&(pSVar2->
                                                  super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                                  ).
                                                  super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                                  .
                                                  super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                                  ._vptr_OrderedStorage + lVar17) + 0x20))
                                 ((long)&(pSVar2->
                                         super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                         ).
                                         super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                         .
                                         super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                         ._vptr_OrderedStorage + lVar17,
                                  (int)local_a0._M_pathname._M_dataplus._M_p[uVar20]);
              if (*(char *)((long)&(poVar16->
                                   super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>)
                                   ._M_payload.
                                   super__Optional_payload_base<supermap::KeyValue<char,_char>_>.
                                   _M_payload + lVar15) == '\x01') {
                *(undefined1 *)
                 ((long)&(poVar16->super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>)
                         ._M_payload.super__Optional_payload_base<supermap::KeyValue<char,_char>_>.
                         _M_payload + lVar15) = 0;
              }
              *(undefined2 *)((long)poVar16 + lVar15 + -2) = uVar10;
              *(undefined1 *)
               ((long)&(poVar16->super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>).
                       _M_payload.super__Optional_payload_base<supermap::KeyValue<char,_char>_>.
                       _M_payload + lVar15) = 1;
            }
            else if (*(char *)((long)&((local_c0.
                                        super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>
                                      )._M_payload.
                                      super__Optional_payload_base<supermap::KeyValue<char,_char>_>.
                                      _M_payload + lVar15) == '\x01') {
              *(undefined1 *)
               ((long)&((local_c0.
                         super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>)._M_payload.
                       super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_payload +
               lVar15) = 0;
            }
          }
        }
        lVar15 = lVar15 + -3;
        lVar17 = lVar17 + -0x38;
        bVar4 = 0 < (long)uVar20;
        uVar13 = uVar14;
        uVar20 = uVar20 - 1;
        bVar6 = bVar5;
      } while (bVar4);
    }
    pvVar7 = local_d0;
    if (!bVar5) break;
    if (local_c0.
        super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar14].
        super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>._M_payload.
        super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_engaged == false) {
      std::__throw_bad_optional_access();
    }
    local_102 = *(KeyValue<char,_char> *)
                 (local_c0.
                  super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar14);
    iVar12 = (int)uVar14;
    cVar8 = local_a0._M_pathname._M_dataplus._M_p[iVar12];
    local_a0._M_pathname._M_dataplus._M_p[iVar12] = cVar8 + '\x01';
    pSVar2 = (local_d0->
             super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    cVar9 = (**(code **)(*(long *)&pSVar2[iVar12].
                                   super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                   .super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                   .super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                        + 8))(pSVar2 + iVar12);
    poVar16 = local_c0.
              super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((char)(cVar8 + '\x01') < cVar9) {
      pSVar2 = (pvVar7->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      _Var11 = (_Storage<supermap::KeyValue<char,_char>,_true>)
               (**(code **)(*(long *)&pSVar2[iVar12].
                                      super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                      .
                                      super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                      .
                                      super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                           + 0x20))
                         (pSVar2 + iVar12,(int)local_a0._M_pathname._M_dataplus._M_p[iVar12]);
      poVar16 = poVar16 + iVar12;
      if ((poVar16->super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>)._M_payload.
          super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_engaged == true) {
        (poVar16->super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>)._M_payload.
        super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_engaged = false;
      }
      (poVar16->super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>)._M_payload.
      super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_payload = _Var11;
      (poVar16->super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>)._M_payload.
      super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_engaged = true;
    }
    else if (local_c0.
             super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar12].
             super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>._M_payload.
             super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_engaged == true) {
      local_c0.
      super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar12].
      super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>._M_payload.
      super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_engaged = false;
    }
    uVar20 = local_d8;
    std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>::
    emplace_back<supermap::KeyValue<char,char>>
              ((vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>
                *)&local_f8,&local_102);
    if (local_c4 <=
        (char)((uint)((int)local_f8.
                           super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (int)local_f8.
                          super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 1)) {
      SingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void>::
      appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<char,char>,void>
                ((SingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void> *)local_100);
      if (local_f8.
          super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_f8.
          super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_f8.
        super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_f8.
             super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      std::vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
      ::reserve(&local_f8,local_a8);
    }
  } while (bVar5);
  SingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void>::
  appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<char,char>,void>
            ((SingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void> *)local_100,
             local_f8.
             super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_f8.
             super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (local_f8.
      super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_f8.
      super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_f8.
    super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_f8.
         super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>::
  reserve(&local_f8,local_a8);
  if (local_f8.
      super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.
      super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.
                          super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.
                          super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0._M_pathname._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_a0._M_pathname._M_dataplus._M_p,
                    local_a0._M_pathname.field_2._M_allocated_capacity -
                    (long)local_a0._M_pathname._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit SortedSingleFileIndexedStorage(
        const std::vector<SortedSingleFileIndexedStorage<T, IndexT, RegisterInfo, FindPattern>> &newer,
        std::string dataFileName,
        std::shared_ptr<io::FileManager> fileManager,
        IndexT batchSize,
        InnerRegisterSupplier registerSupplier
    ) : SingleFileIndexedStorage<T, IndexT, RegisterInfo>(
        std::move(dataFileName),
        std::move(fileManager),
        std::move(registerSupplier)
    ) {
        const std::size_t storagesCount = newer.size();
        std::vector<IndexT> currentFrontPointers(storagesCount);
        std::vector<std::optional<T>> frontLine(storagesCount, std::nullopt);
        std::uint64_t totalSize = 0;
        for (std::size_t i = 0; i < storagesCount; ++i) {
            if (newer[i].getItemsCount() > 0) {
                frontLine[i].emplace(newer[i].get(0));
                totalSize += newer[i].getItemsCount();
            }
        }
        getRegister().reserve(totalSize);
        auto updateOnce = [&](std::int32_t i) {
            if (++currentFrontPointers[i] < newer[i].getItemsCount()) {
                frontLine[i].emplace(newer[i].get(currentFrontPointers[i]));
            } else {
                frontLine[i].reset();
            }
        };

        std::vector<T> writeBuffer;
        writeBuffer.reserve(batchSize);

        auto dropWriteBuffer = [&]() {
            appendAll(writeBuffer.begin(), writeBuffer.end());
            writeBuffer.clear();
            writeBuffer.reserve(batchSize);
        };

        while (true) {
            std::size_t min = 0;
            bool hasMin = false;
            for (std::int32_t i = storagesCount - 1; i >= 0; --i) {
                if (!frontLine[i].has_value()) {
                    continue;
                }
                if (!hasMin) {
                    hasMin = true;
                    min = i;
                    continue;
                }
                if (frontLine[i].value() < frontLine[min].value()) {
                    min = i;
                } else if (frontLine[i].value() == frontLine[min].value()) {
                    updateOnce(i);
                }
            }
            if (!hasMin) {
                break;
            }
            T minItem = frontLine[min].value();
            updateOnce(min);
            writeBuffer.push_back(std::move(minItem));
            if (static_cast<IndexT>(writeBuffer.size()) >= batchSize) {
                dropWriteBuffer();
            }
        }
        dropWriteBuffer();
    }